

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

GLuint __thiscall gl4cts::GPUShaderFP64Test10::functionObject::getResultStride(functionObject *this)

{
  uint uVar1;
  GLuint GVar2;
  uint local_1c;
  GLuint local_18;
  GLuint i;
  GLuint stride;
  GLuint n_results;
  functionObject *this_local;
  
  uVar1 = (*this->_vptr_functionObject[5])();
  local_18 = 0;
  for (local_1c = 0; local_1c < uVar1; local_1c = local_1c + 1) {
    GVar2 = getResultStride(this,local_1c);
    local_18 = GVar2 + local_18;
  }
  return local_18;
}

Assistant:

glw::GLuint GPUShaderFP64Test10::functionObject::getResultStride() const
{
	const glw::GLuint n_results = getResultCount();
	glw::GLuint		  stride	= 0;

	for (glw::GLuint i = 0; i < n_results; ++i)
	{
		stride += getResultStride(i);
	}

	return stride;
}